

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Version_abi_cxx11_
          (string *__return_storage_ptr__,TimeZoneInfo *this)

{
  TimeZoneInfo *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->version_);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeZoneInfo::Version() const { return version_; }